

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

tree_node * __thiscall RegexTree::clean_block(RegexTree *this,tree_node *ptr)

{
  tree_node *ptVar1;
  tree_node *ret;
  tree_node *ptr_local;
  RegexTree *this_local;
  
  if (ptr == (tree_node *)0x0) {
    this_local = (RegexTree *)0x0;
  }
  else {
    ptVar1 = clean_block(this,ptr->left);
    ptr->left = ptVar1;
    ptVar1 = clean_block(this,ptr->right);
    ptr->right = ptVar1;
    this_local = (RegexTree *)ptr;
    if ((ptr->c == '\x11') && (this_local = (RegexTree *)ptr->left, ptr != (tree_node *)0x0)) {
      operator_delete(ptr,0x18);
    }
  }
  return (tree_node *)this_local;
}

Assistant:

tree_node *RegexTree::clean_block(tree_node *ptr) {
    if (ptr == nullptr)
        return nullptr;
    ptr->left = clean_block(ptr->left);
    ptr->right = clean_block(ptr->right);

    if (ptr->c == BLOCK) {
        tree_node *ret = ptr->left;
        delete ptr;
        return ret;
    } else
        return ptr;
}